

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# unqlite.c
# Opt level: O3

int vm_builtin_utf8_encode(jx9_context *pCtx,int nArg,jx9_value **apArg)

{
  byte bVar1;
  byte *pbVar2;
  byte *pbVar3;
  int nByte;
  uint local_30;
  int local_2c;
  
  if (0 < nArg) {
    pbVar2 = (byte *)jx9_value_to_string(*apArg,&local_2c);
    if (0 < (long)local_2c) {
      pbVar3 = pbVar2 + local_2c;
      do {
        bVar1 = *pbVar2;
        local_30 = (uint)bVar1;
        if ((char)bVar1 < '\0') {
          local_30 = bVar1 >> 6 | 0xc0;
          jx9_value_string(pCtx->pRet,(char *)&local_30,1);
          local_30 = bVar1 & 0xffffffbf;
        }
        pbVar2 = pbVar2 + 1;
        jx9_value_string(pCtx->pRet,(char *)&local_30,1);
      } while (pbVar2 < pbVar3);
      return 0;
    }
  }
  jx9MemObjRelease(pCtx->pRet);
  return 0;
}

Assistant:

static int vm_builtin_utf8_encode(jx9_context *pCtx, int nArg, jx9_value **apArg)
{
	const unsigned char *zIn, *zEnd;
	int nByte, c, e;
	if( nArg < 1 ){
		/* Missing arguments, return null */
		jx9_result_null(pCtx);
		return JX9_OK;
	}
	/* Extract the target string */
	zIn = (const unsigned char *)jx9_value_to_string(apArg[0], &nByte);
	if( nByte < 1 ){
		/* Empty string, return null */
		jx9_result_null(pCtx);
		return JX9_OK;
	}
	zEnd = &zIn[nByte];
	/* Start the encoding process */
	for(;;){
		if( zIn >= zEnd ){
			/* End of input */
			break;
		}
		c = zIn[0];
		/* Advance the stream cursor */
		zIn++;
		/* Encode */
		if( c<0x00080 ){
			e = (c&0xFF);
			jx9_result_string(pCtx, (const char *)&e, (int)sizeof(char));
		}else if( c<0x00800 ){
			e = 0xC0 + ((c>>6)&0x1F);
			jx9_result_string(pCtx, (const char *)&e, (int)sizeof(char));
			e = 0x80 + (c & 0x3F);
			jx9_result_string(pCtx, (const char *)&e, (int)sizeof(char));
		}else if( c<0x10000 ){
			e = 0xE0 + ((c>>12)&0x0F);
			jx9_result_string(pCtx, (const char *)&e, (int)sizeof(char));
			e = 0x80 + ((c>>6) & 0x3F);
			jx9_result_string(pCtx, (const char *)&e, (int)sizeof(char));
			e = 0x80 + (c & 0x3F);
			jx9_result_string(pCtx, (const char *)&e, (int)sizeof(char));
		}else{
			e = 0xF0 + ((c>>18) & 0x07);
			jx9_result_string(pCtx, (const char *)&e, (int)sizeof(char));
			e = 0x80 + ((c>>12) & 0x3F);
			jx9_result_string(pCtx, (const char *)&e, (int)sizeof(char));
			e = 0x80 + ((c>>6) & 0x3F);
			jx9_result_string(pCtx, (const char *)&e, (int)sizeof(char));
			e = 0x80 + (c & 0x3F);
			jx9_result_string(pCtx, (const char *)&e, (int)sizeof(char));
		} 
	}
	/* All done */
	return JX9_OK;
}